

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::Swap(Reflection *this,Message *message1,Message *message2)

{
  uint uVar1;
  undefined4 uVar2;
  long lVar3;
  int iVar4;
  LogMessage *pLVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Message *message2_00;
  ulong uVar6;
  _Vector_impl_data *this_00;
  _Vector_impl_data *__x;
  Reflection *extraout_RDX;
  Reflection *extraout_RDX_00;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int i;
  long lVar11;
  LogFinisher local_61;
  LogMessage local_60;
  undefined4 extraout_var_01;
  
  if (message1 != message2) {
    (*(message1->super_MessageLite)._vptr_MessageLite[0x15])(message1);
    if (extraout_RDX != this) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x25c);
      pLVar5 = internal::LogMessage::operator<<
                         (&local_60,"CHECK failed: (message1->GetReflection()) == (this): ");
      pLVar5 = internal::LogMessage::operator<<(pLVar5,"First argument to Swap() (of type \"");
      iVar4 = (*(message1->super_MessageLite)._vptr_MessageLite[0x15])(message1);
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,*(string **)(CONCAT44(extraout_var,iVar4) + 8));
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar5 = internal::LogMessage::operator<<(pLVar5,*(string **)(this->descriptor_ + 8));
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      internal::LogFinisher::operator=(&local_61,pLVar5);
      internal::LogMessage::~LogMessage(&local_60);
    }
    (*(message2->super_MessageLite)._vptr_MessageLite[0x15])();
    if (extraout_RDX_00 != this) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x264);
      pLVar5 = internal::LogMessage::operator<<
                         (&local_60,"CHECK failed: (message2->GetReflection()) == (this): ");
      pLVar5 = internal::LogMessage::operator<<(pLVar5,"Second argument to Swap() (of type \"");
      iVar4 = (*(message2->super_MessageLite)._vptr_MessageLite[0x15])(message2);
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,*(string **)(CONCAT44(extraout_var_00,iVar4) + 8));
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar5 = internal::LogMessage::operator<<(pLVar5,*(string **)(this->descriptor_ + 8));
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      internal::LogFinisher::operator=(&local_61,pLVar5);
      internal::LogMessage::~LogMessage(&local_60);
    }
    uVar8 = (ulong)(uint)(this->schema_).metadata_offset_;
    uVar6 = *(ulong *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar8);
    uVar10 = uVar6;
    if ((uVar6 & 1) != 0) {
      uVar10 = *(ulong *)((uVar6 & 0xfffffffffffffffe) + 0x18);
    }
    uVar8 = *(ulong *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar8);
    if ((uVar8 & 1) != 0) {
      uVar8 = *(ulong *)((uVar8 & 0xfffffffffffffffe) + 0x18);
    }
    if (uVar10 == uVar8) {
      uVar6 = (ulong)(uint)(this->schema_).has_bits_offset_;
      if (uVar6 != 0xffffffff) {
        uVar1 = *(uint *)(this->descriptor_ + 0x68);
        uVar8 = 0;
        uVar10 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar10 = uVar8;
        }
        iVar4 = 0;
        for (; uVar10 * 0x98 - uVar8 != 0; uVar8 = uVar8 + 0x98) {
          lVar9 = *(long *)(this->descriptor_ + 0x28);
          if (*(int *)(lVar9 + 0x3c + uVar8) != 3) {
            iVar4 = iVar4 + (uint)(*(long *)(lVar9 + 0x58 + uVar8) == 0);
          }
        }
        uVar10 = (long)(iVar4 + 0x1f) / 0x20;
        uVar7 = 0;
        uVar8 = uVar10 & 0xffffffff;
        if ((int)uVar10 < 1) {
          uVar8 = uVar7;
        }
        for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
          uVar2 = *(undefined4 *)
                   ((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar7 * 4 + uVar6);
          *(undefined4 *)
           ((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar7 * 4 + uVar6) =
               *(undefined4 *)
                ((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar7 * 4 + uVar6);
          *(undefined4 *)
           ((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar7 * 4 + uVar6) = uVar2;
        }
      }
      lVar9 = 0;
      for (lVar11 = 0; lVar11 <= this->last_non_weak_field_index_; lVar11 = lVar11 + 1) {
        lVar3 = *(long *)(this->descriptor_ + 0x28);
        if (*(long *)(lVar3 + 0x58 + lVar9) == 0) {
          SwapField(this,message1,message2,(FieldDescriptor *)(lVar3 + lVar9));
        }
        lVar9 = lVar9 + 0x98;
      }
      uVar1 = *(uint *)(this->descriptor_ + 0x6c);
      uVar10 = 0;
      uVar6 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar6 = uVar10;
      }
      for (; uVar6 * 0x30 - uVar10 != 0; uVar10 = uVar10 + 0x30) {
        SwapOneofField(this,message1,message2,
                       (OneofDescriptor *)(*(long *)(this->descriptor_ + 0x30) + uVar10));
      }
      uVar6 = (ulong)(uint)(this->schema_).extensions_offset_;
      if (uVar6 != 0xffffffff) {
        internal::ExtensionSet::Swap
                  ((ExtensionSet *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar6),
                   (ExtensionSet *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar6))
        ;
      }
      this_00 = (_Vector_impl_data *)MutableUnknownFields(this,message1);
      __x = (_Vector_impl_data *)MutableUnknownFields(this,message2);
      std::
      _Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ::_Vector_impl_data::_M_swap_data(this_00,__x);
    }
    else {
      if ((uVar6 & 1) != 0) {
        uVar6 = *(ulong *)((uVar6 & 0xfffffffffffffffe) + 0x18);
      }
      iVar4 = (*(message1->super_MessageLite)._vptr_MessageLite[4])(message1,uVar6);
      message2_00 = (Message *)CONCAT44(extraout_var_01,iVar4);
      (*(message2_00->super_MessageLite)._vptr_MessageLite[0x11])(message2_00,message2);
      (*(message2->super_MessageLite)._vptr_MessageLite[0x10])(message2,message1);
      Swap(this,message1,message2_00);
      uVar6 = *(ulong *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                        (ulong)(uint)(this->schema_).metadata_offset_);
      if ((uVar6 & 1) != 0) {
        uVar6 = *(ulong *)((uVar6 & 0xfffffffffffffffe) + 0x18);
      }
      if (uVar6 == 0) {
        (*(message2_00->super_MessageLite)._vptr_MessageLite[1])(message2_00);
      }
    }
  }
  return;
}

Assistant:

void Reflection::Swap(Message* message1, Message* message2) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
      << "First argument to Swap() (of type \""
      << message1->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
      << "Second argument to Swap() (of type \""
      << message2->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";

  // Check that both messages are in the same arena (or both on the heap). We
  // need to copy all data if not, due to ownership semantics.
  if (GetArena(message1) != GetArena(message2)) {
    // Slow copy path.
    // Use our arena as temp space, if available.
    Message* temp = message1->New(GetArena(message1));
    temp->MergeFrom(*message2);
    message2->CopyFrom(*message1);
    Swap(message1, temp);
    if (GetArena(message1) == nullptr) {
      delete temp;
    }
    return;
  }

  if (schema_.HasHasbits()) {
    uint32* has_bits1 = MutableHasBits(message1);
    uint32* has_bits2 = MutableHasBits(message2);

    int fields_with_has_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (field->is_repeated() || field->containing_oneof()) {
        continue;
      }
      fields_with_has_bits++;
    }

    int has_bits_size = (fields_with_has_bits + 31) / 32;

    for (int i = 0; i < has_bits_size; i++) {
      std::swap(has_bits1[i], has_bits2[i]);
    }
  }

  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->containing_oneof()) continue;
    SwapField(message1, message2, field);
  }
  const int oneof_decl_count = descriptor_->oneof_decl_count();
  for (int i = 0; i < oneof_decl_count; i++) {
    SwapOneofField(message1, message2, descriptor_->oneof_decl(i));
  }

  if (schema_.HasExtensionSet()) {
    MutableExtensionSet(message1)->Swap(MutableExtensionSet(message2));
  }

  MutableUnknownFields(message1)->Swap(MutableUnknownFields(message2));
}